

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int next_token(parse_state *state)

{
  int iVar1;
  int t;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  byte bVar6;
  
  iVar1 = state->nexttoken;
  if (iVar1 != 0) {
    state->nexttoken = 0;
    return iVar1;
  }
  pbVar2 = (byte *)state->ptr;
  do {
    bVar6 = *pbVar2;
    if (bVar6 < 0xd) {
      if (bVar6 != 9) {
        if (bVar6 == 0) {
LAB_00106a4e:
          state->ptr = (char *)pbVar2;
          return 0;
        }
        if (bVar6 != 10) goto LAB_00106955;
        state->line = state->line + 1;
        pbVar2 = pbVar2 + 1;
        goto LAB_0010694c;
      }
    }
    else if ((bVar6 != 0xd) && (bVar6 != 0x20)) break;
    pbVar2 = pbVar2 + 1;
  } while( true );
  if (bVar6 == 0x23) {
    for (; (*pbVar2 != 0 && (*pbVar2 != 10)); pbVar2 = pbVar2 + 1) {
    }
    state->line = state->line + 1;
LAB_0010694c:
    state->ptr = (char *)pbVar2;
    return 2;
  }
LAB_00106955:
  state->text = (char *)pbVar2;
  pbVar4 = pbVar2;
LAB_0010695c:
  do {
    lVar5 = 1;
    while (pbVar3 = pbVar2, bVar6 = *pbVar3, bVar6 == 0x5c) {
      bVar6 = pbVar3[1];
      if (bVar6 < 0xd) {
        if (bVar6 == 10) goto LAB_001069a3;
        if (bVar6 != 0) goto LAB_00106a2e;
        goto LAB_00106a5b;
      }
      if (0x5b < bVar6) {
        if (bVar6 < 0x72) {
          if (bVar6 == 0x5c) goto LAB_00106a40;
          if (bVar6 == 0x6e) {
            bVar6 = 10;
            goto LAB_00106a40;
          }
        }
        else {
          if (bVar6 == 0x72) {
            bVar6 = 0xd;
            goto LAB_00106a40;
          }
          if (bVar6 == 0x74) {
            bVar6 = 9;
            goto LAB_00106a40;
          }
        }
LAB_00106a2e:
        lVar5 = 2;
        goto LAB_00106a40;
      }
      if (bVar6 != 0xd) goto LAB_00106a2e;
      pbVar2 = pbVar3 + 2;
      if (pbVar3[2] == 10) {
LAB_001069a3:
        state->line = state->line + 1;
        for (pbVar2 = pbVar3 + 2; (*pbVar2 == 0x20 || (*pbVar2 == 9)); pbVar2 = pbVar2 + 1) {
        }
      }
    }
    if (bVar6 < 0xd) {
      if (bVar6 == 0) goto LAB_00106a5e;
      if (bVar6 == 9) goto LAB_00106a5b;
      if (bVar6 == 10) {
        state->nexttoken = 2;
LAB_00106a5b:
        pbVar3 = pbVar3 + 1;
LAB_00106a5e:
        state->ptr = (char *)pbVar3;
        *pbVar4 = 0;
        return 1;
      }
LAB_00106a40:
      pbVar2 = pbVar3 + lVar5;
      *pbVar4 = bVar6;
      pbVar4 = pbVar4 + 1;
      goto LAB_0010695c;
    }
    if ((bVar6 == 0xd) || (bVar6 == 0x20)) goto LAB_00106a5b;
    if (bVar6 != 0x22) goto LAB_00106a40;
    while( true ) {
      pbVar2 = pbVar3 + 1;
      bVar6 = *pbVar2;
      if (bVar6 == 0x22) break;
      if (bVar6 == 0) goto LAB_00106a4e;
      *pbVar4 = bVar6;
      pbVar4 = pbVar4 + 1;
      pbVar3 = pbVar2;
    }
    pbVar2 = pbVar3 + 2;
  } while( true );
}

Assistant:

int next_token(struct parse_state *state)
{
    char *x = state->ptr;
    char *s;

    if (state->nexttoken) {
        int t = state->nexttoken;
        state->nexttoken = 0;
        return t;
    }

    for (;;) {
        switch (*x) {
        case 0:
            state->ptr = x;
            return T_EOF;
        case '\n':
            state->line++;
            x++;
            state->ptr = x;
            return T_NEWLINE;
        case ' ':
        case '\t':
        case '\r':
            x++;
            continue;
        case '#':
            while (*x && (*x != '\n')) x++;
            state->line++;
            state->ptr = x;
            return T_NEWLINE;
        default:
            goto text;
        }
    }

textdone:
    state->ptr = x;
    *s = 0;
    return T_TEXT;
text:
    state->text = s = x;
textresume:
    for (;;) {
        switch (*x) {
        case 0:
            goto textdone;
        case ' ':
        case '\t':
        case '\r':
            x++;
            goto textdone;
        case '\n':
            state->nexttoken = T_NEWLINE;
            x++;
            goto textdone;
        case '"':
            x++;
            for (;;) {
                switch (*x) {
                case 0:
                        /* unterminated quoted thing */
                    state->ptr = x;
                    return T_EOF;
                case '"':
                    x++;
                    goto textresume;
                default:
                    *s++ = *x++;
                }
            }
            break;
        case '\\':
            x++;
            switch (*x) {
            case 0:
                goto textdone;
            case 'n':
                *s++ = '\n';
                break;
            case 'r':
                *s++ = '\r';
                break;
            case 't':
                *s++ = '\t';
                break;
            case '\\':
                *s++ = '\\';
                break;
            case '\r':
                    /* \ <cr> <lf> -> line continuation */
                if (x[1] != '\n') {
                    x++;
                    continue;
                }
            case '\n':
                    /* \ <lf> -> line continuation */
                state->line++;
                x++;
                    /* eat any extra whitespace */
                while((*x == ' ') || (*x == '\t')) x++;
                continue;
            default:
                    /* unknown escape -- just copy */
                *s++ = *x++;
            }
            continue;
        default:
            *s++ = *x++;
        }
    }
    return T_EOF;
}